

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

Filetree filetree_init(char **roots,size_t roots_size,gboolean recursive,gboolean follow_symlinks,
                      gboolean no_sort,GSList **errors)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  filename_representations *pfVar4;
  code *pcVar5;
  filename_representations *fr;
  GError *err;
  GDir *dir;
  GTree *sub_dir_tree;
  size_t i;
  GTree *root_tree;
  GSList **errors_local;
  gboolean local_20;
  gboolean no_sort_local;
  gboolean follow_symlinks_local;
  gboolean recursive_local;
  size_t roots_size_local;
  char **roots_local;
  
  pcVar5 = compare_filenames;
  if (no_sort != 0) {
    pcVar5 = compare_insert_last;
  }
  root_tree = (GTree *)errors;
  errors_local._4_4_ = no_sort;
  local_20 = follow_symlinks;
  no_sort_local = recursive;
  _follow_symlinks_local = (GTree *)roots_size;
  roots_size_local = (size_t)roots;
  i = g_tree_new_full(pcVar5,0,filename_representations_free,filetree_destroy);
  for (sub_dir_tree = (GTree *)0x0; sub_dir_tree < _follow_symlinks_local;
      sub_dir_tree = sub_dir_tree + 1) {
    if ((local_20 != 0) ||
       (iVar1 = g_file_test(*(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8),2),
       iVar1 == 0)) {
      iVar1 = g_file_test(*(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8),4);
      if (iVar1 == 0) {
        iVar1 = g_file_test(*(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8),1);
        if (iVar1 == 0) {
          uVar3 = *(undefined8 *)root_tree;
          uVar2 = g_error_new(1,1,"File \'%s\' not found",
                              *(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8));
          uVar3 = g_slist_prepend(uVar3,uVar2);
          *(undefined8 *)root_tree = uVar3;
        }
        else {
          pfVar4 = filename_representations_new
                             (*(char **)(roots_size_local + (long)sub_dir_tree * 8),2);
          g_tree_insert(i,pfVar4,0);
        }
      }
      else if (no_sort_local == 0) {
        uVar3 = *(undefined8 *)root_tree;
        uVar2 = g_error_new(1,1,"Skipping \'%s\', is a directory",
                            *(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8));
        uVar3 = g_slist_prepend(uVar3,uVar2);
        *(undefined8 *)root_tree = uVar3;
      }
      else {
        fr = (filename_representations *)0x0;
        err = (GError *)g_dir_open(*(undefined8 *)(roots_size_local + (long)sub_dir_tree * 8),0,&fr)
        ;
        if (fr == (filename_representations *)0x0) {
          pfVar4 = filename_representations_new
                             (*(char **)(roots_size_local + (long)sub_dir_tree * 8),1);
          dir = (GDir *)g_tree_new_full(compare_filenames,0,filename_representations_free,
                                        filetree_destroy);
          g_tree_insert(i,pfVar4,dir);
          walk_recursive(*(char **)(roots_size_local + (long)sub_dir_tree * 8),(GDir *)err,
                         (GTree *)dir,local_20,(GSList **)root_tree);
          g_dir_close(err);
        }
        else {
          uVar3 = g_slist_prepend(*(undefined8 *)root_tree,fr);
          *(undefined8 *)root_tree = uVar3;
          fr = (filename_representations *)0x0;
        }
      }
    }
  }
  uVar3 = g_slist_reverse(*(undefined8 *)root_tree);
  *(undefined8 *)root_tree = uVar3;
  return (Filetree)i;
}

Assistant:

Filetree filetree_init(char *roots[],
                       size_t roots_size,
                       gboolean recursive,
                       gboolean follow_symlinks,
                       gboolean no_sort,
                       GSList **errors)
{
    GTree *root_tree = g_tree_new_full(no_sort ? compare_insert_last
                                               : compare_filenames,
                                       NULL,
                                       filename_representations_free,
                                       filetree_destroy);
    size_t i;

    for (i = 0; i < roots_size; ++i) {
        GTree *sub_dir_tree;
        GDir *dir;
        GError *err;
        struct filename_representations *fr;

        if (!follow_symlinks
            && g_file_test(roots[i], G_FILE_TEST_IS_SYMLINK)) {
            continue;
        }

        if (g_file_test(roots[i], G_FILE_TEST_IS_DIR)) {
            if (!recursive) {
                *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                            "Skipping '%s', is a directory", roots[i]));
                continue;
            }
            err = NULL;
            dir = g_dir_open(roots[i], 0, &err);
            if (err) {
                *errors = g_slist_prepend(*errors, err);
                err = NULL;
                continue;
            }
            fr = filename_representations_new(roots[i], FILETREE_DIR);
            sub_dir_tree = g_tree_new_full(compare_filenames, NULL,
                                           filename_representations_free,
                                           filetree_destroy);

            g_tree_insert(root_tree, fr, sub_dir_tree);
            walk_recursive(roots[i], dir, sub_dir_tree,
                           follow_symlinks, errors);
            g_dir_close(dir);
        } else if (g_file_test(roots[i], G_FILE_TEST_IS_REGULAR)) {
            fr = filename_representations_new(roots[i], FILETREE_FILE);
            g_tree_insert(root_tree, fr, NULL);
        } else {
            *errors = g_slist_prepend(*errors, g_error_new(1, 1,
                        "File '%s' not found", roots[i]));
        }
    }

    *errors = g_slist_reverse(*errors);

    return root_tree;
}